

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O1

int av1_hash_is_vertical_perfect(YV12_BUFFER_CONFIG *picture,int block_size,int x_start,int y_start)

{
  int iVar1;
  long lVar2;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  uint8_t *puVar6;
  short *psVar7;
  long lVar8;
  ulong uVar9;
  uint8_t *puVar10;
  short *psVar11;
  bool bVar12;
  
  iVar1 = (picture->field_4).field_0.y_stride;
  lVar2 = (long)iVar1;
  lVar8 = (long)(y_start * iVar1);
  puVar3 = (picture->field_5).buffers[0] + lVar8 + x_start;
  if ((picture->flags & 8) == 0) {
    bVar12 = 0 < block_size;
    if (0 < block_size) {
      uVar5 = (ulong)(uint)block_size;
      puVar6 = (picture->field_5).buffers[0] + lVar8 + x_start + lVar2;
      uVar9 = 0;
      do {
        if (block_size != 1) {
          lVar8 = uVar5 - 1;
          puVar10 = puVar6;
          do {
            if (*puVar10 != puVar3[uVar9]) {
LAB_001d2797:
              if (!bVar12) {
                return 1;
              }
              return 0;
            }
            puVar10 = puVar10 + lVar2;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        uVar9 = uVar9 + 1;
        bVar12 = uVar9 < uVar5;
        puVar6 = puVar6 + 1;
      } while (uVar9 != uVar5);
    }
  }
  else {
    bVar12 = 0 < block_size;
    if (0 < block_size) {
      lVar8 = (long)puVar3 * 2;
      uVar5 = (ulong)(uint)block_size;
      psVar7 = (short *)(lVar8 + lVar2 * 2);
      uVar9 = 0;
      do {
        if (block_size != 1) {
          lVar4 = uVar5 - 1;
          psVar11 = psVar7;
          do {
            if (*psVar11 != *(short *)(lVar8 + uVar9 * 2)) goto LAB_001d2797;
            psVar11 = psVar11 + lVar2;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        uVar9 = uVar9 + 1;
        bVar12 = uVar9 < uVar5;
        psVar7 = psVar7 + 1;
      } while (uVar9 != uVar5);
    }
  }
  return 1;
}

Assistant:

int av1_hash_is_vertical_perfect(const YV12_BUFFER_CONFIG *picture,
                                 int block_size, int x_start, int y_start) {
  const int stride = picture->y_stride;
  const uint8_t *p = picture->y_buffer + y_start * stride + x_start;

  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *p16 = CONVERT_TO_SHORTPTR(p);
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p16[j * stride + i] != p16[i]) {
          return 0;
        }
      }
    }
  } else {
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p[j * stride + i] != p[i]) {
          return 0;
        }
      }
    }
  }
  return 1;
}